

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  uint8_t *puVar2;
  long lVar3;
  byte bVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ushort uVar9;
  uint32_t *puVar10;
  uint uVar11;
  uint8_t *s1_orig;
  PreparedDictionary *pPVar12;
  uint8_t *puVar13;
  ulong *puVar14;
  ulong uVar15;
  byte bVar16;
  PreparedDictionary *pPVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  PreparedDictionary *pPVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  uint8_t uVar27;
  ushort uVar28;
  uint uVar29;
  long lVar30;
  BrotliEncoderParams *pBVar31;
  long lVar32;
  uint8_t *puVar33;
  PreparedDictionary *pPVar34;
  bool bVar35;
  long lVar36;
  size_t sVar37;
  uint8_t *puVar38;
  uint uVar39;
  uint8_t *puVar40;
  PreparedDictionary *local_138;
  ulong local_128 [4];
  BrotliEncoderParams *local_108;
  ulong local_100;
  PreparedDictionary *local_f8;
  PreparedDictionary *local_f0;
  ulong local_e8;
  ulong local_e0;
  size_t *local_d8;
  size_t local_d0;
  PreparedDictionary *local_c8;
  PreparedDictionary *local_c0;
  int local_b4;
  ulong local_b0;
  PreparedDictionary *local_a8;
  undefined8 local_a0;
  int local_94;
  PreparedDictionary *local_90;
  long local_88;
  ulong local_80;
  ContextLut local_78;
  undefined1 *local_70;
  PreparedDictionary *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  PreparedDictionary *local_40;
  ulong local_38;
  
  local_90 = (PreparedDictionary *)((position - 7) + num_bytes);
  local_40 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    local_40 = local_90;
  }
  local_88 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_88 = 0x40;
  }
  local_128[3] = *(ulong *)dist_cache;
  local_70 = (undefined1 *)(position + num_bytes);
  if (local_70 <= (undefined1 *)(position + 8)) {
    local_d8 = last_insert_len;
LAB_0111763c:
    *(undefined1 **)dist_cache = local_70 + (local_128[3] - position);
    *(long *)commands = *(long *)commands + ((long)local_d8 - (long)last_insert_len >> 4);
    return;
  }
  local_c8 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
  local_48 = *(long *)(literal_context_lut + 0x10);
  local_78 = literal_context_lut;
  local_50 = *(long *)(literal_context_lut + 0x60);
  local_f8 = (PreparedDictionary *)(local_88 + position);
  sVar5 = (params->dictionary).compound.num_chunks;
  local_80 = ringbuffer_mask & 0xffffffff;
  local_60 = (ulong)(uint)((int)local_88 * 4);
  local_58 = (position - 1) + num_bytes;
  local_d8 = last_insert_len;
  local_108 = params;
  local_d0 = ringbuffer_mask;
  puVar26 = local_70;
  pBVar31 = params;
  sVar37 = ringbuffer_mask;
  local_a8 = (PreparedDictionary *)position;
LAB_011167a1:
  local_100 = (long)puVar26 - (long)local_a8;
  local_c0 = local_c8;
  if (local_a8 < local_c8) {
    local_c0 = local_a8;
  }
  uVar24 = (ulong)local_a8 & sVar37;
  puVar2 = ringbuffer + uVar24;
  uVar27 = ringbuffer[uVar24];
  local_f0 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
  pPVar12 = (PreparedDictionary *)((long)local_a8 - (long)local_f0);
  local_e0 = 0x7e4;
  local_80._0_4_ = (uint)ringbuffer_mask;
  if ((pPVar12 < local_a8) &&
     (uVar11 = (uint)pPVar12 & (uint)local_80, uVar27 == ringbuffer[uVar11])) {
    puVar13 = ringbuffer + uVar11;
    uVar20 = local_100;
    puVar33 = puVar2;
    puVar40 = puVar13;
    if (7 < local_100) {
      lVar32 = 0;
      lVar19 = 0;
LAB_01116813:
      if (*(ulong *)(puVar2 + lVar32) == *(ulong *)(puVar13 + lVar32)) goto code_r0x01116820;
      uVar22 = *(ulong *)(puVar13 + lVar32) ^ *(ulong *)(puVar2 + lVar32);
      uVar20 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      local_e8 = (uVar20 >> 3 & 0x1fffffff) - lVar19;
      goto LAB_01116898;
    }
    goto LAB_01116851;
  }
  goto LAB_011168be;
code_r0x01116820:
  lVar32 = lVar32 + 8;
  lVar36 = local_100 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar36 - 8U < 8) goto code_r0x0111683b;
  goto LAB_01116813;
code_r0x0111683b:
  puVar40 = puVar13 + -lVar19;
  puVar33 = puVar2 + -lVar19;
  uVar20 = lVar19 + local_100;
LAB_01116851:
  if (uVar20 != 0) {
    uVar22 = 0;
    do {
      uVar15 = uVar22;
      if (puVar40[uVar22] != puVar33[uVar22]) break;
      uVar22 = uVar22 + 1;
      uVar15 = uVar20;
    } while (uVar20 != uVar22);
    puVar40 = puVar40 + uVar15;
  }
  local_e8 = (long)puVar40 - (long)puVar13;
LAB_01116898:
  if ((local_e8 < 4) || (uVar20 = local_e8 * 0x87 + 0x78f, uVar20 < 0x7e5)) {
LAB_011168be:
    local_f0 = (PreparedDictionary *)0x0;
    local_e8 = 0;
  }
  else {
    uVar27 = puVar2[local_e8];
    local_e0 = uVar20;
  }
  local_128[0] = (ulong)(*(long *)(ringbuffer + uVar24) * 0x7bd3579bd3000000) >> 0x30;
  local_128[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar24) * 0x7bd3579bd3000000) >>
                                 0x30) + 8 & 0xffff);
  uVar11 = (uint)local_a8;
  puVar14 = local_128;
  bVar35 = true;
LAB_0111690f:
  uVar29 = *(uint *)(sVar5 + *puVar14 * 4);
  puVar33 = ringbuffer + ((uint)sVar37 & uVar29);
  if (((uVar27 == puVar33[local_e8]) && (local_a8 != (PreparedDictionary *)(ulong)uVar29)) &&
     (pPVar12 = (PreparedDictionary *)((long)local_a8 - (long)(ulong)uVar29), pPVar12 <= local_c0))
  {
    uVar24 = local_100;
    puVar40 = puVar33;
    puVar13 = puVar2;
    if (7 < local_100) {
      lVar32 = 0;
      lVar19 = 0;
LAB_01116962:
      if (*(ulong *)(puVar2 + lVar32) == *(ulong *)(puVar33 + lVar32)) goto code_r0x0111696f;
      uVar20 = *(ulong *)(puVar33 + lVar32) ^ *(ulong *)(puVar2 + lVar32);
      uVar24 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar19;
      goto LAB_011169ea;
    }
    goto LAB_01116997;
  }
  goto LAB_01116a2e;
code_r0x0111696f:
  lVar32 = lVar32 + 8;
  lVar36 = local_100 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar36 - 8U < 8) goto code_r0x01116985;
  goto LAB_01116962;
code_r0x01116985:
  puVar40 = puVar33 + -lVar19;
  puVar13 = puVar2 + -lVar19;
  uVar24 = lVar19 + local_100;
LAB_01116997:
  if (uVar24 != 0) {
    uVar20 = 0;
    do {
      uVar22 = uVar20;
      if (puVar40[uVar20] != puVar13[uVar20]) break;
      uVar20 = uVar20 + 1;
      uVar22 = uVar24;
    } while (uVar24 != uVar20);
    puVar40 = puVar40 + uVar22;
  }
  uVar24 = (long)puVar40 - (long)puVar33;
LAB_011169ea:
  pBVar31 = params;
  if (3 < uVar24) {
    iVar18 = 0x1f;
    if ((uint)pPVar12 != 0) {
      for (; (uint)pPVar12 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar20 = (ulong)(iVar18 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_e0 < uVar20) {
      uVar27 = puVar2[uVar24];
      local_e0 = uVar20;
      local_f0 = pPVar12;
      local_e8 = uVar24;
    }
  }
LAB_01116a2e:
  puVar14 = local_128 + 1;
  bVar8 = !bVar35;
  bVar35 = false;
  if (bVar8) goto code_r0x01116a43;
  goto LAB_0111690f;
code_r0x01116a43:
  *(uint *)(sVar5 + *(long *)((long)local_128 + (ulong)(uVar11 & 8)) * 4) = uVar11;
  if (0x1f < local_100 && ((ulong)local_a8 & 3) == 0) {
    pPVar12 = (pBVar31->dictionary).compound.chunks[1];
    if (pPVar12 <= local_a8) {
      uVar29 = (uint)(pBVar31->dictionary).compound.total_size;
      iVar18 = *(int *)((long)(pBVar31->dictionary).compound.chunks + 0x14);
      iVar7 = *(int *)((pBVar31->dictionary).compound.chunks + 3);
LAB_01116aa9:
      uVar39 = uVar29 & 0x3fffffff;
      bVar16 = ringbuffer[(ulong)pPVar12 & sVar37];
      bVar4 = ringbuffer[(ulong)&pPVar12[1].source_size & sVar37];
      if (uVar39 < 0x1000000) {
        pPVar17 = (params->dictionary).compound.chunks[0];
        uVar23 = (&pPVar17->magic)[uVar39];
        (&pPVar17->magic)[uVar39] = (uint32_t)pPVar12;
        if ((pPVar12 == local_a8) && (uVar23 != 0xffffffff)) {
          uVar39 = uVar11 - uVar23;
          if ((PreparedDictionary *)(ulong)uVar39 <= local_c0) {
            puVar33 = ringbuffer + (uVar23 & (uint)sVar37);
            lVar32 = 0;
            lVar19 = 0;
LAB_01116b26:
            lVar36 = lVar19;
            if (*(ulong *)(puVar2 + lVar32) == *(ulong *)(puVar33 + lVar32)) goto code_r0x01116b36;
            uVar20 = *(ulong *)(puVar33 + lVar32) ^ *(ulong *)(puVar2 + lVar32);
            uVar24 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            uVar24 = lVar32 + (uVar24 >> 3 & 0x1fffffff);
            goto LAB_01116bb7;
          }
        }
      }
      goto LAB_01116af8;
    }
    goto LAB_01116c32;
  }
  goto LAB_01116c3a;
code_r0x01116b36:
  lVar32 = lVar32 + 8;
  lVar19 = lVar36 + -8;
  if ((local_100 + lVar36) - 8 < 8) goto code_r0x01116b4d;
  goto LAB_01116b26;
code_r0x01116b4d:
  if (local_100 - lVar32 == 0) {
    puVar40 = puVar33 + lVar32;
  }
  else {
    puVar40 = puVar33 + (local_100 - lVar32) + lVar32;
    uVar24 = 8 - lVar36;
    do {
      if (puVar33[uVar24] != puVar2[uVar24]) {
        puVar40 = puVar33 + uVar24;
        break;
      }
      uVar24 = uVar24 + 1;
    } while (local_100 != uVar24);
  }
  uVar24 = (long)puVar40 - (long)puVar33;
LAB_01116bb7:
  sVar37 = ringbuffer_mask;
  if ((3 < uVar24) && (local_e8 < uVar24)) {
    iVar6 = 0x1f;
    if (uVar39 != 0) {
      for (; uVar39 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar20 = (ulong)(iVar6 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_e0 < uVar20) {
      local_e0 = uVar20;
      local_f0 = (PreparedDictionary *)(ulong)uVar39;
      local_e8 = uVar24;
    }
  }
LAB_01116af8:
  uVar29 = ~(uint)bVar16 * iVar7 + (uint)bVar4 + uVar29 * iVar18 + 1;
  pPVar12 = (PreparedDictionary *)&pPVar12->num_items;
  if (local_a8 < pPVar12) goto LAB_01116c0b;
  goto LAB_01116aa9;
LAB_01116c0b:
  *(uint *)&(params->dictionary).compound.total_size = uVar29;
  pBVar31 = params;
LAB_01116c32:
  (pBVar31->dictionary).compound.chunks[1] = (PreparedDictionary *)&local_a8->num_items;
LAB_01116c3a:
  if (0x7e4 < local_e0) {
    local_68 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_38 = local_128[3] + 4;
    lVar19 = local_58 - (long)local_a8;
    local_b4 = 0;
LAB_01116c7c:
    uVar24 = local_100 - 1;
    local_b0 = local_e8 - 1;
    if (uVar24 <= local_e8 - 1) {
      local_b0 = uVar24;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      local_b0 = 0;
    }
    pPVar12 = (PreparedDictionary *)((long)&local_a8->magic + 1);
    local_c0 = local_c8;
    if (pPVar12 < local_c8) {
      local_c0 = pPVar12;
    }
    puVar2 = ringbuffer + ((ulong)pPVar12 & sVar37);
    uVar27 = puVar2[local_b0];
    local_f8 = (PreparedDictionary *)0x7e4;
    if ((pPVar12 <= (PreparedDictionary *)((long)pPVar12 - (long)local_68)) ||
       (puVar33 = ringbuffer +
                  ((uint)(PreparedDictionary *)((long)pPVar12 - (long)local_68) & (uint)local_80),
       uVar27 != puVar33[local_b0])) {
      local_138 = (PreparedDictionary *)0x0;
      goto LAB_01116d83;
    }
    puVar40 = puVar2;
    puVar13 = puVar33;
    uVar20 = uVar24;
    if (7 < uVar24) {
      lVar32 = 0;
      lVar36 = 0;
LAB_01116d16:
      if (*(ulong *)(puVar2 + lVar32) == *(ulong *)(puVar33 + lVar32)) goto code_r0x01116d27;
      uVar22 = *(ulong *)(puVar33 + lVar32) ^ *(ulong *)(puVar2 + lVar32);
      uVar20 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar36;
      goto LAB_0111716a;
    }
    goto LAB_01116d4c;
  }
  local_128[3] = local_128[3] + 1;
  position = (long)&local_a8->magic + 1;
  if (local_f8 < position) {
    if ((PreparedDictionary *)((long)&local_f8->magic + local_60) < position) {
      pPVar12 = (PreparedDictionary *)((long)&local_a8->bucket_bits + 1);
      if (local_90 <= pPVar12) {
        pPVar12 = local_90;
      }
      for (; position < pPVar12; position = (size_t)&((PreparedDictionary *)position)->num_items) {
        *(uint *)(sVar5 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position & sVar37))
                                                        * 0x7bd3579bd3000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_128[3] = local_128[3] + 4;
      }
    }
    else {
      pPVar12 = (PreparedDictionary *)((long)&local_a8->source_size + 1);
      if (local_90 <= pPVar12) {
        pPVar12 = local_90;
      }
      for (; position < pPVar12; position = (long)&((PreparedDictionary *)position)->magic + 2) {
        *(uint *)(sVar5 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position & sVar37))
                                                        * 0x7bd3579bd3000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_128[3] = local_128[3] + 2;
      }
    }
  }
LAB_011175c3:
  puVar26 = local_70;
  local_a8 = (PreparedDictionary *)position;
  if (local_70 <= &((PreparedDictionary *)position)->source_size) goto LAB_0111763c;
  goto LAB_011167a1;
code_r0x01116d27:
  lVar32 = lVar32 + 8;
  lVar30 = lVar19 + lVar36;
  lVar36 = lVar36 + -8;
  if (lVar30 - 8U < 8) goto code_r0x01116d3d;
  goto LAB_01116d16;
code_r0x01116d3d:
  puVar13 = puVar33 + -lVar36;
  puVar40 = puVar2 + -lVar36;
  uVar20 = lVar36 + lVar19;
LAB_01116d4c:
  if (uVar20 != 0) {
    uVar22 = 0;
    do {
      uVar15 = uVar22;
      if (puVar13[uVar22] != puVar40[uVar22]) break;
      uVar22 = uVar22 + 1;
      uVar15 = uVar20;
    } while (uVar20 != uVar22);
    puVar13 = puVar13 + uVar15;
  }
  uVar20 = (long)puVar13 - (long)puVar33;
LAB_0111716a:
  if ((uVar20 < 4) || (uVar22 = uVar20 * 0x87 + 0x78f, uVar22 < 0x7e5)) {
    local_138 = (PreparedDictionary *)0x0;
  }
  else {
    uVar27 = puVar2[uVar20];
    local_f8 = (PreparedDictionary *)uVar22;
    local_b0 = uVar20;
    local_138 = local_68;
  }
LAB_01116d83:
  local_128[0] = (ulong)(*(long *)(ringbuffer + ((ulong)pPVar12 & sVar37)) * 0x7bd3579bd3000000) >>
                 0x30;
  local_128[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + ((ulong)pPVar12 & sVar37)) *
                                         0x7bd3579bd3000000) >> 0x30) + 8 & 0xffff);
  uVar11 = (uint)pPVar12;
  lVar32 = *(long *)((long)local_128 + (ulong)(uVar11 & 8));
  local_a0 = lVar32;
  puVar14 = local_128;
  bVar35 = true;
LAB_01116dc9:
  uVar29 = *(uint *)(sVar5 + *puVar14 * 4);
  puVar33 = ringbuffer + ((uint)sVar37 & uVar29);
  if (((uVar27 == puVar33[local_b0]) && (pPVar12 != (PreparedDictionary *)(ulong)uVar29)) &&
     (pPVar17 = (PreparedDictionary *)((long)pPVar12 - (long)(ulong)uVar29), pPVar17 <= local_c0)) {
    puVar40 = puVar2;
    puVar13 = puVar33;
    uVar20 = uVar24;
    if (7 < uVar24) {
      lVar36 = 0;
      lVar30 = 0;
LAB_01116e19:
      if (*(ulong *)(puVar2 + lVar36) == *(ulong *)(puVar33 + lVar36)) goto code_r0x01116e26;
      uVar22 = *(ulong *)(puVar33 + lVar36) ^ *(ulong *)(puVar2 + lVar36);
      uVar20 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar30;
      goto LAB_01116e9d;
    }
    goto LAB_01116e50;
  }
  goto LAB_01116edf;
code_r0x01116e26:
  lVar36 = lVar36 + 8;
  lVar3 = lVar19 + lVar30;
  lVar30 = lVar30 + -8;
  if (lVar3 - 8U < 8) goto code_r0x01116e3c;
  goto LAB_01116e19;
code_r0x01116e3c:
  puVar13 = puVar33 + -lVar30;
  puVar40 = puVar2 + -lVar30;
  uVar20 = lVar30 + lVar19;
LAB_01116e50:
  if (uVar20 != 0) {
    uVar22 = 0;
    do {
      uVar15 = uVar22;
      if (puVar13[uVar22] != puVar40[uVar22]) break;
      uVar22 = uVar22 + 1;
      uVar15 = uVar20;
    } while (uVar20 != uVar22);
    puVar13 = puVar13 + uVar15;
    sVar37 = ringbuffer_mask;
  }
  uVar20 = (long)puVar13 - (long)puVar33;
LAB_01116e9d:
  if (3 < uVar20) {
    iVar18 = 0x1f;
    if ((uint)pPVar17 != 0) {
      for (; (uint)pPVar17 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar22 = (ulong)(iVar18 * -0x1e + 0x780) + uVar20 * 0x87;
    if (local_f8 < uVar22) {
      uVar27 = puVar2[uVar20];
      local_f8 = (PreparedDictionary *)uVar22;
      local_b0 = uVar20;
      local_138 = pPVar17;
    }
  }
LAB_01116edf:
  puVar14 = local_128 + 1;
  bVar8 = !bVar35;
  bVar35 = false;
  if (bVar8) goto code_r0x01116ef2;
  goto LAB_01116dc9;
code_r0x01116ef2:
  *(uint *)(sVar5 + lVar32 * 4) = uVar11;
  pBVar31 = params;
  if (uVar24 < 0x20 || ((ulong)pPVar12 & 3) != 0) goto LAB_011170df;
  pPVar17 = (params->dictionary).compound.chunks[1];
  uVar20 = local_e8;
  if (pPVar17 <= pPVar12) {
    uVar29 = (uint)(params->dictionary).compound.total_size;
    iVar18 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
    local_a0 = CONCAT44((int)((ulong)lVar32 >> 0x20),iVar18);
    local_94 = *(int *)((params->dictionary).compound.chunks + 3);
LAB_01116f58:
    uVar39 = uVar29 & 0x3fffffff;
    bVar16 = ringbuffer[(ulong)pPVar17 & sVar37];
    bVar4 = ringbuffer[(ulong)&pPVar17[1].source_size & sVar37];
    if (uVar39 < 0x1000000) {
      pPVar34 = (pBVar31->dictionary).compound.chunks[0];
      uVar23 = (&pPVar34->magic)[uVar39];
      (&pPVar34->magic)[uVar39] = (uint32_t)pPVar17;
      if ((pPVar17 == pPVar12) && (uVar23 != 0xffffffff)) {
        uVar39 = uVar11 - uVar23;
        if ((PreparedDictionary *)(ulong)uVar39 <= local_c0) {
          puVar33 = ringbuffer + (uVar23 & (uint)sVar37);
          lVar36 = 0;
          lVar32 = 0;
LAB_01116fd8:
          lVar30 = lVar32;
          if (*(ulong *)(puVar2 + lVar30) == *(ulong *)(puVar33 + lVar30)) goto code_r0x01116fe5;
          uVar22 = *(ulong *)(puVar33 + lVar30) ^ *(ulong *)(puVar2 + lVar30);
          uVar20 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar22 = (uVar20 >> 3 & 0x1fffffff) + lVar30;
          goto LAB_01117059;
        }
      }
    }
    goto LAB_01116fa2;
  }
  goto LAB_011170ce;
code_r0x01116fe5:
  lVar32 = lVar30 + 8;
  lVar3 = local_100 + lVar36;
  lVar36 = lVar36 + -8;
  if (lVar3 - 9U < 8) goto code_r0x01117000;
  goto LAB_01116fd8;
code_r0x01117000:
  puVar40 = puVar33 + lVar32;
  puVar13 = puVar40;
  if (lVar30 + 9U != local_100) {
    puVar38 = puVar2 + lVar32;
    lVar32 = lVar36 + local_100 + -1;
    do {
      puVar13 = puVar40;
      if (*puVar40 != *puVar38) break;
      puVar38 = puVar38 + 1;
      puVar40 = puVar40 + 1;
      lVar32 = lVar32 + -1;
      puVar13 = puVar33 + (local_100 - 1);
    } while (lVar32 != 0);
  }
  uVar22 = (long)puVar13 - (long)puVar33;
LAB_01117059:
  pBVar31 = local_108;
  sVar37 = local_d0;
  uVar20 = local_e8;
  if ((3 < uVar22) &&
     (pBVar31 = params, sVar37 = ringbuffer_mask, uVar20 = local_e8, local_b0 < uVar22)) {
    iVar7 = 0x1f;
    if (uVar39 != 0) {
      for (; uVar39 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar15 = (ulong)(iVar7 * -0x1e + 0x780) + uVar22 * 0x87;
    if (local_f8 < uVar15) {
      local_b0 = uVar22;
      local_138 = (PreparedDictionary *)(ulong)uVar39;
      local_f8 = (PreparedDictionary *)uVar15;
    }
  }
LAB_01116fa2:
  uVar29 = (uint)bVar4 + uVar29 * iVar18 + ~(uint)bVar16 * local_94 + 1;
  pPVar17 = (PreparedDictionary *)&pPVar17->num_items;
  if (pPVar12 < pPVar17) goto LAB_011170bb;
  goto LAB_01116f58;
LAB_011170bb:
  *(uint *)&(pBVar31->dictionary).compound.total_size = uVar29;
LAB_011170ce:
  (pBVar31->dictionary).compound.chunks[1] = (PreparedDictionary *)((long)&local_a8->num_items + 1);
  local_e8 = uVar20;
LAB_011170df:
  pPVar17 = local_a8;
  uVar20 = local_128[3];
  if ((local_f8 < local_e0 + 0xaf) ||
     (local_e8 = local_b0, pPVar17 = pPVar12, local_f0 = local_138, uVar20 = local_38, local_b4 == 3
     )) goto LAB_01117239;
  uVar20 = local_128[3] + 1;
  local_b4 = local_b4 + 1;
  puVar10 = &local_a8->source_size;
  lVar19 = lVar19 + -1;
  local_e0 = (ulong)local_f8;
  local_100 = uVar24;
  local_128[3] = uVar20;
  local_a8 = pPVar12;
  if (local_70 <= (undefined1 *)((long)puVar10 + 1U)) goto LAB_01117239;
  goto LAB_01116c7c;
LAB_01117239:
  pPVar12 = (PreparedDictionary *)((long)&pPVar17->magic + local_48);
  if (local_c8 <= pPVar12) {
    pPVar12 = local_c8;
  }
  pPVar12 = (PreparedDictionary *)((long)&pPVar12->magic + local_50);
  uVar29 = (uint)local_e8;
  uVar11 = (uint)uVar20;
  if (pPVar12 < local_f0) {
LAB_0111726a:
    puVar26 = (undefined1 *)((long)&local_f0->hash_bits + 3);
LAB_0111726e:
    if ((local_f0 <= pPVar12) && (puVar26 != (undefined1 *)0x0)) {
      *(undefined4 *)((long)(hasher->common).extra + 0xc) =
           *(undefined4 *)((hasher->common).extra + 1);
      *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
      *(int *)(hasher->common).extra = (int)local_f0;
    }
    *(uint *)local_d8 = uVar11;
    *(uint *)((long)local_d8 + 4) = uVar29;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar39 = 0;
    if (puVar1 <= puVar26) {
      bVar16 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar25 = puVar26 + ((4L << (bVar16 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar39 = 0x1f;
      uVar23 = (uint)puVar25;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar39 = (uVar39 ^ 0xffffffe0) + 0x1f;
      uVar24 = (ulong)(((ulong)puVar25 >> ((ulong)uVar39 & 0x3f) & 1) != 0);
      lVar19 = (ulong)uVar39 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar26 = (undefined1 *)
                ((ulong)(puVar1 + (uVar24 + lVar19 * 2 + 0xfffe << (bVar16 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar16 & 0x1f)) & uVar23)) | lVar19 * 0x400);
      uVar39 = (uint)((long)puVar25 - (uVar24 + 2 << ((byte)uVar39 & 0x3f)) >> (bVar16 & 0x3f));
      pBVar31 = params;
    }
  }
  else {
    pPVar34 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    if (local_f0 != pPVar34) {
      pPVar21 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
      puVar26 = &DAT_00000001;
      if (local_f0 != pPVar21) {
        uVar24 = (long)local_f0 + (3 - (long)pPVar34);
        if (uVar24 < 7) {
          bVar16 = (byte)((int)uVar24 << 2);
          uVar39 = 0x9750468;
        }
        else {
          uVar24 = (long)local_f0 + (3 - (long)pPVar21);
          if (6 < uVar24) {
            puVar26 = (undefined1 *)0x2;
            if ((local_f0 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
               (puVar26 = (undefined1 *)0x3,
               local_f0 != (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc))
               ) goto LAB_0111726a;
            goto LAB_0111726e;
          }
          bVar16 = (byte)((int)uVar24 << 2);
          uVar39 = 0xfdb1ace;
        }
        puVar26 = (undefined1 *)(ulong)(uVar39 >> (bVar16 & 0x1f) & 0xf);
      }
      goto LAB_0111726e;
    }
    *(uint *)local_d8 = uVar11;
    *(uint *)((long)local_d8 + 4) = uVar29;
    puVar26 = (undefined1 *)0x0;
    uVar39 = 0;
  }
  *(short *)((long)local_d8 + 0xe) = (short)puVar26;
  *(uint *)(local_d8 + 1) = uVar39;
  if (5 < uVar20) {
    if (uVar20 < 0x82) {
      uVar11 = 0x1f;
      uVar39 = (uint)(uVar20 - 2);
      if (uVar39 != 0) {
        for (; uVar39 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (int)(uVar20 - 2 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar11 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar20 < 0x842) {
      uVar39 = 0x1f;
      if (uVar11 - 0x42 != 0) {
        for (; uVar11 - 0x42 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar11 = (uVar39 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar11 = 0x15;
      if (0x1841 < uVar20) {
        uVar11 = (uint)(ushort)(0x17 - (uVar20 < 0x5842));
      }
    }
  }
  uVar24 = (ulong)(int)uVar29;
  if (uVar24 < 10) {
    uVar39 = uVar29 - 2;
  }
  else if (uVar24 < 0x86) {
    uVar29 = 0x1f;
    uVar39 = (uint)(uVar24 - 6);
    if (uVar39 != 0) {
      for (; uVar39 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar39 = (int)(uVar24 - 6 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar29 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar39 = 0x17;
    if (uVar24 < 0x846) {
      uVar39 = 0x1f;
      if (uVar29 - 0x46 != 0) {
        for (; uVar29 - 0x46 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar39 = (uVar39 ^ 0xffe0) + 0x2c;
    }
  }
  uVar9 = (ushort)uVar39;
  uVar28 = (uVar9 & 7) + ((ushort)uVar11 & 7) * 8;
  if (((((ulong)puVar26 & 0x3ff) == 0) && ((ushort)uVar11 < 8)) && (uVar9 < 0x10)) {
    if (7 < uVar9) {
      uVar28 = uVar28 | 0x40;
    }
  }
  else {
    iVar18 = ((uVar11 & 0xffff) >> 3) * 3 + ((uVar39 & 0xffff) >> 3);
    uVar28 = uVar28 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_d8 + 0xc) = uVar28;
  *num_commands = *num_commands + uVar20;
  position = (long)&pPVar17->magic + local_e8;
  pPVar12 = local_40;
  if (position < local_40) {
    pPVar12 = (PreparedDictionary *)position;
  }
  pPVar34 = (PreparedDictionary *)((long)&pPVar17->magic + 2);
  if (local_f0 < (PreparedDictionary *)(local_e8 >> 2)) {
    pPVar21 = (PreparedDictionary *)(position + (long)local_f0 * -4);
    if (pPVar21 < pPVar34) {
      pPVar21 = pPVar34;
    }
    pPVar34 = pPVar21;
    if (pPVar12 < pPVar21) {
      pPVar34 = pPVar12;
    }
  }
  local_f8 = (PreparedDictionary *)((long)&pPVar17->magic + local_e8 * 2 + local_88);
  local_d8 = local_d8 + 2;
  if (pPVar34 < pPVar12) {
    do {
      *(uint *)(sVar5 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                ((ulong)pPVar34 & sVar37)) *
                                                      0x7bd3579bd3000000) >> 0x30) +
                                ((uint)pPVar34 & 8) & 0xffff) * 4) = (uint)pPVar34;
      pPVar34 = (PreparedDictionary *)((long)&pPVar34->magic + 1);
    } while (pPVar12 != pPVar34);
  }
  local_128[3] = 0;
  goto LAB_011175c3;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}